

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring64_bitmap_range_closed_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ushort uVar1;
  art_ref_t ref;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  run_container_t *prVar11;
  long lVar12;
  uint uVar13;
  uint64_t uVar14;
  run_container_t *container;
  uint uVar15;
  ushort x;
  uint8_t min_high48 [6];
  uint8_t max_high48 [6];
  art_iterator_t it;
  uint local_f0;
  ushort local_ec;
  uint local_e4;
  uint local_e0;
  ushort local_dc;
  uint64_t local_d8;
  roaring64_bitmap_t *local_d0;
  uint64_t local_c8;
  art_iterator_t local_c0;
  
  if (max < min) {
    uVar14 = 0;
  }
  else {
    local_f0 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_ec = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_e0 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    local_dc = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
    uVar14 = 0;
    memset(&local_c0,0,0x90);
    ref = (r->art).root;
    local_d0 = r;
    local_c0.art = &r->art;
    if (ref != 0) {
      art_node_iterator_lower_bound(ref,&local_c0,(art_key_chunk_t *)&local_f0);
    }
    x = (short)min - 1;
    local_e4 = (uint)max & 0xffff;
    local_d8 = max;
    local_c8 = min;
    do {
      if (local_c0.value == (ulong *)0x0) {
        return uVar14;
      }
      uVar7 = (uint)local_c0.key._0_4_ >> 0x18 | (local_c0.key._0_4_ & 0xff0000) >> 8 |
              (local_c0.key._0_4_ & 0xff00) << 8 | local_c0.key._0_4_ << 0x18;
      uVar9 = local_e0 >> 0x18 | (local_e0 & 0xff0000) >> 8 | (local_e0 & 0xff00) << 8 |
              local_e0 << 0x18;
      if (uVar7 == uVar9) {
        uVar7 = (uint)(ushort)(local_c0.key._4_2_ << 8 | (ushort)local_c0.key._4_2_ >> 8);
        uVar9 = (uint)(ushort)(local_dc << 8 | local_dc >> 8);
        uVar15 = 0;
        if (uVar7 != uVar9) goto LAB_001278dc;
      }
      else {
LAB_001278dc:
        uVar15 = -(uint)(uVar7 < uVar9) | 1;
      }
      if ((int)uVar15 < 1) {
        uVar5 = *local_c0.value;
        container = (run_container_t *)local_d0->containers[uVar5 >> 8];
        bVar2 = (byte)uVar5;
        if (uVar15 == 0) {
          prVar11 = container;
          bVar4 = bVar2;
          if (bVar2 == 4) {
            bVar4 = *(byte *)&container->runs;
            prVar11 = *(run_container_t **)container;
          }
          if (bVar4 == 3) {
            uVar7 = run_container_rank(prVar11,(uint16_t)local_e4);
          }
          else if (bVar4 == 2) {
            iVar10 = prVar11->n_runs + -1;
            uVar9 = 0;
            uVar7 = (uint)bVar4;
            do {
              if (iVar10 < (int)uVar9) {
                uVar13 = ~uVar9;
                break;
              }
              uVar13 = uVar9 + iVar10 >> 1;
              uVar1 = *(ushort *)
                       ((long)&prVar11->runs->value + (ulong)(uVar9 + iVar10 & 0xfffffffe));
              if (uVar1 < (ushort)max) {
                uVar9 = uVar13 + 1;
                bVar3 = true;
                uVar13 = uVar7;
              }
              else if ((ushort)max < uVar1) {
                iVar10 = uVar13 - 1;
                bVar3 = true;
                uVar13 = uVar7;
              }
              else {
                bVar3 = false;
              }
              uVar7 = uVar13;
            } while (bVar3);
            uVar7 = ~uVar13;
            if (-1 < (int)uVar13) {
              uVar7 = uVar13 + 1;
            }
          }
          else {
            uVar7 = bitset_container_rank((bitset_container_t *)prVar11,(uint16_t)local_e4);
          }
        }
        else {
          prVar11 = container;
          bVar4 = bVar2;
          if (bVar2 == 4) {
            bVar4 = *(byte *)&container->runs;
            prVar11 = *(run_container_t **)container;
          }
          if (bVar4 == 3) {
            uVar7 = croaring_hardware_support();
            if ((uVar7 & 2) == 0) {
              uVar7 = croaring_hardware_support();
              if ((uVar7 & 1) == 0) {
                uVar7 = prVar11->n_runs;
                lVar8 = (long)(int)uVar7;
                if (0 < lVar8) {
                  lVar12 = 0;
                  do {
                    uVar7 = uVar7 + prVar11->runs[lVar12].length;
                    lVar12 = lVar12 + 1;
                  } while (lVar8 != lVar12);
                }
              }
              else {
                uVar7 = _avx2_run_container_cardinality(prVar11);
              }
            }
            else {
              uVar7 = _avx512_run_container_cardinality(prVar11);
            }
          }
          else {
            uVar7 = prVar11->n_runs;
          }
        }
        max = local_d8;
        uVar14 = uVar14 + (long)(int)uVar7;
        if (((short)local_c8 != 0) &&
           (local_c0.key._4_2_ == local_ec && local_c0.key._0_4_ == local_f0)) {
          if (bVar2 == 4) {
            uVar5 = (ulong)*(byte *)&container->runs;
            container = *(run_container_t **)container;
          }
          if ((char)uVar5 == '\x03') {
            uVar7 = run_container_rank(container,x);
          }
          else if ((int)(uVar5 & 0xff) == 2) {
            iVar10 = container->n_runs + -1;
            uVar7 = 0;
            uVar5 = uVar5 & 0xff;
            do {
              if (iVar10 < (int)uVar7) {
                uVar9 = ~uVar7;
                break;
              }
              uVar9 = uVar7 + iVar10 >> 1;
              uVar6 = (ulong)uVar9;
              uVar1 = *(ushort *)
                       ((long)&container->runs->value + (ulong)(uVar7 + iVar10 & 0xfffffffe));
              if (uVar1 < x) {
                uVar7 = uVar9 + 1;
                bVar3 = true;
                uVar6 = uVar5;
              }
              else if (x < uVar1) {
                iVar10 = uVar9 - 1;
                bVar3 = true;
                uVar6 = uVar5;
              }
              else {
                bVar3 = false;
              }
              uVar9 = (uint)uVar6;
              uVar5 = uVar6;
            } while (bVar3);
            uVar7 = ~uVar9;
            if (-1 < (int)uVar9) {
              uVar7 = uVar9 + 1;
            }
          }
          else {
            uVar7 = bitset_container_rank((bitset_container_t *)container,x);
          }
          uVar14 = uVar14 - (long)(int)uVar7;
        }
        art_iterator_move(&local_c0,true);
      }
    } while ((int)uVar15 < 1);
  }
  return uVar14;
}

Assistant:

uint64_t roaring64_bitmap_range_closed_cardinality(const roaring64_bitmap_t *r,
                                                   uint64_t min, uint64_t max) {
    if (min > max) {
        return 0;
    }

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);
        container_t *container = get_container(r, leaf);
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality += container_rank(container, typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality += container_get_cardinality(container, typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -= container_rank(container, typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}